

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int ftp_file_exist(char *filename)

{
  int iVar1;
  int __fd;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *__stream;
  FILE *__stream_00;
  int *port_00;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  int port;
  char *local_1460;
  char *local_1458;
  int tmpint;
  char ip [100];
  char host [100];
  char proto [100];
  char tmpstr [1200];
  char recbuf [1200];
  char fn [1200];
  char turl [1200];
  
  sVar4 = strlen(filename);
  if (sVar4 < 0x4aa) {
    builtin_strncpy(turl,"ftp://",7);
    strcat(turl,filename);
    pcVar6 = host;
    port_00 = &port;
    iVar1 = NET_ParseUrl(turl,proto,pcVar6,port_00,fn);
    if (iVar1 != 0) {
      snprintf(recbuf,0x4b0,"URL Parse Error (ftp_file_exist) %s",filename);
      ffpmsg(recbuf);
      return 0;
    }
    port = 0x15;
    pcVar5 = strrchr(pcVar6,0x40);
    if (pcVar5 == (char *)0x0) {
      local_1460 = "user@host.com";
      local_1458 = "anonymous";
    }
    else {
      *pcVar5 = '\0';
      pcVar6 = pcVar5 + 1;
      local_1458 = host;
      local_1460 = strchr(local_1458,0x3a);
      if (local_1460 == (char *)0x0) {
        local_1460 = "user@host.com";
      }
      else {
        *local_1460 = '\0';
        local_1460 = local_1460 + 1;
      }
    }
    iVar1 = 10;
    while (bVar8 = iVar1 != 0, iVar1 = iVar1 + -1, bVar8) {
      __fd = NET_TcpConnect(pcVar6,port);
      __stream = fdopen(__fd,"r");
      if (__stream == (FILE *)0x0) {
        pcVar6 = "Failed to convert socket to stdio file (ftp_file_exist)";
        goto LAB_00136b0a;
      }
      iVar2 = ftp_status((FILE *)__stream,"220");
      if (iVar2 == 0) {
        pcVar6 = local_1458;
        snprintf(tmpstr,0x4b0,"USER %s\r\n");
        iVar1 = (int)pcVar6;
        sVar4 = strlen(tmpstr);
        NET_SendRaw(__fd,tmpstr,(int)sVar4,iVar1);
        iVar2 = ftp_status((FILE *)__stream,"331 ");
        if (iVar2 != 0) {
          if (iVar2 == 0x226) {
            ffpmsg("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
            fclose(__stream);
            NET_SendRaw(__fd,"QUIT\r\n",6,iVar1);
            return -1;
          }
          pcVar6 = "USER error no 331 seen (ftp_file_exist)";
          goto LAB_00136d82;
        }
        pcVar6 = local_1460;
        snprintf(tmpstr,0x4b0,"PASS %s\r\n");
        iVar1 = (int)pcVar6;
        sVar4 = strlen(tmpstr);
        NET_SendRaw(__fd,tmpstr,(int)sVar4,iVar1);
        iVar2 = ftp_status((FILE *)__stream,"230 ");
        if (iVar2 == 0) {
          pcVar6 = fn;
          pcVar5 = strrchr(pcVar6,0x2f);
          if (pcVar5 == (char *)0x0) {
            builtin_strncpy(tmpstr,"CWD /\r\n",8);
          }
          else {
            *pcVar5 = '\0';
            pcVar6 = pcVar5 + 1;
            if (fn[0] == '/') {
              iVar1 = (int)fn + 1;
            }
            else {
              if (fn[0] == '\0') {
                builtin_strncpy(tmpstr,"CWD /\r\n",8);
                goto LAB_00136e3e;
              }
              iVar1 = (int)fn;
            }
            snprintf(tmpstr,0x4b0,"CWD %s\r\n");
          }
LAB_00136e3e:
          sVar4 = strlen(tmpstr);
          NET_SendRaw(__fd,tmpstr,(int)sVar4,iVar1);
          iVar2 = ftp_status((FILE *)__stream,"250 ");
          if (iVar2 != 0) {
            pcVar6 = "CWD error, no 250 seen (ftp_file_exist)";
            goto LAB_00136e74;
          }
          if (*pcVar6 == '\0') {
LAB_0013716a:
            pcVar6 = "Null file name (ftp_file_exist)";
            goto LAB_00136e74;
          }
          builtin_strncpy(tmpstr,"TYPE I\r\n",9);
          sVar4 = strlen(tmpstr);
          NET_SendRaw(__fd,tmpstr,(int)sVar4,iVar1);
          iVar2 = ftp_status((FILE *)__stream,"200 ");
          if (iVar2 != 0) {
            pcVar6 = "TYPE I error, 200 not seen (ftp_file_exist)";
            goto LAB_00136e74;
          }
          NET_SendRaw(__fd,"PASV\r\n",6,iVar1);
          pcVar5 = fgets(recbuf,0x4b0,__stream);
          if (pcVar5 == (char *)0x0) {
LAB_00137176:
            pcVar6 = "PASV error (ftp_file_exist)";
            goto LAB_00136e74;
          }
          if (((recbuf[0] == '2') && (recbuf[1] == '2')) && (recbuf[2] == '7')) {
            pcVar5 = strchr(recbuf,0x28);
            if (pcVar5 != (char *)0x0) {
              *pcVar5 = '\0';
              ip[0] = '\0';
              pcVar5 = strtok(pcVar5 + 1,",)");
              if (pcVar5 != (char *)0x0) {
                strcpy(ip,pcVar5);
                sVar4 = strlen(ip);
                (ip + sVar4)[0] = '.';
                (ip + sVar4)[1] = '\0';
                pcVar5 = strtok((char *)0x0,",)");
                if (pcVar5 != (char *)0x0) {
                  strcat(ip,pcVar5);
                  sVar4 = strlen(ip);
                  (ip + sVar4)[0] = '.';
                  (ip + sVar4)[1] = '\0';
                  pcVar5 = strtok((char *)0x0,",)");
                  if (pcVar5 != (char *)0x0) {
                    strcat(ip,pcVar5);
                    sVar4 = strlen(ip);
                    (ip + sVar4)[0] = '.';
                    (ip + sVar4)[1] = '\0';
                    pcVar5 = strtok((char *)0x0,",)");
                    if (pcVar5 != (char *)0x0) {
                      strcat(ip,pcVar5);
                      pcVar5 = strtok((char *)0x0,",)");
                      if (pcVar5 != (char *)0x0) {
                        __isoc99_sscanf(pcVar5,"%d",&port);
                        port = port << 8;
                        pcVar5 = strtok((char *)0x0,",)");
                        if (pcVar5 != (char *)0x0) {
                          __isoc99_sscanf(pcVar5,"%d",&tmpint);
                          port = port + tmpint;
                          if (*pcVar6 != '\0') {
                            iVar2 = NET_TcpConnect(ip,port);
                            __stream_00 = fdopen(iVar2,"r");
                            if (__stream_00 == (FILE *)0x0) {
                              pcVar6 = "Could not connect to passive port (ftp_file_exist)";
LAB_00136d82:
                              ffpmsg(pcVar6);
                              fclose(__stream);
                              NET_SendRaw(__fd,"QUIT\r\n",6,iVar1);
                              return 0;
                            }
                            snprintf(tmpstr,0x4b0,"RETR %s\r\n");
                            iVar1 = (int)pcVar6;
                            sVar4 = strlen(tmpstr);
                            NET_SendRaw(__fd,tmpstr,(int)sVar4,iVar1);
                            iVar3 = ftp_status((FILE *)__stream,"150 ");
                            uVar7 = (uint)(iVar3 == 0);
                            fclose(__stream_00);
                            NET_SendRaw(iVar2,"QUIT\r\n",6,iVar1);
                            fclose(__stream);
                            goto LAB_00136e8d;
                          }
                          goto LAB_0013716a;
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00137176;
          }
        }
        else {
          pcVar6 = "PASS error, no 230 seen (ftp_file_exist)";
LAB_00136e74:
          ffpmsg(pcVar6);
        }
        uVar7 = 0;
        fclose(__stream);
LAB_00136e8d:
        NET_SendRaw(__fd,"QUIT\r\n",6,iVar1);
        return uVar7;
      }
      ffpmsg("error connecting to remote server, no 220 seen (ftp_file_exist)");
      fclose(__stream);
      NET_SendRaw(__fd,"QUIT\r\n",6,(int)port_00);
      sleep(5);
    }
    pcVar6 = "error connecting to remote server, no 220 seen (ftp_open_network)";
  }
  else {
    pcVar6 = "ftp filename is too long (ftp_file_exist)";
  }
LAB_00136b0a:
  ffpmsg(pcVar6);
  return 0;
}

Assistant:

int ftp_file_exist(char *filename)
{
  FILE *ftpfile;
  FILE *command;
  int sock;
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii, tryingtologin = 1;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_file_exist)");
    return 0;
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_file_exist) %s",filename);
    ffpmsg(errorstr);
    return 0;
  }

  port = 21;
  /* we might have a user name */
  username = "anonymous";
  password = "user@host.com";
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
  /* Connect to the host on the required port */
  sock = NET_TcpConnect(newhost,port);
  /* convert it to a stdio file */
  if (NULL == (command = fdopen(sock,"r"))) {
    ffpmsg ("Failed to convert socket to stdio file (ftp_file_exist)");
    return 0;
  }

  /* Wait for the 220 response */
  if (ftp_status(command,"220")) {
    ffpmsg ("error connecting to remote server, no 220 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);

/*    ffpmsg("sleeping for 5 in ftp_file_exist, then try again"); */

    sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

  } else {
    tryingtologin = 0;
    break;
  }
  
  }  

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (0);
  }
 
  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  /* If command is refused due to the connection requiring SSL (ie. an
     fpts connection), this is where it will first be detected by way
     of a 550 error code. */
     
  status = ftp_status(command,"331 ");
  if (status == 550)
  {
    ffpmsg ("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return -1;
  }
  else if (status) {
    ffpmsg ("USER error no 331 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  status = NET_SendRaw(sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,command))) {
    ffpmsg ("PASV error (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(command,"150 ")) {
      fclose(ftpfile); 
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    /* if we got here then the file probably exists */

    fclose(ftpfile); 
    NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
    fclose(command); 
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 1;
  }
  
  /* no passive mode */

  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  return 0;
}